

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewPointerLocation(Union *this)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  size_t newSize;
  
  uVar2 = (*this->parent->_vptr_StructOrGroup[2])();
  puVar3 = (this->pointerLocations).builder.pos;
  if (puVar3 == (this->pointerLocations).builder.endPtr) {
    puVar1 = (this->pointerLocations).builder.ptr;
    newSize = 4;
    if (puVar3 != puVar1) {
      newSize = (long)puVar3 - (long)puVar1 >> 1;
    }
    kj::Vector<unsigned_int>::setCapacity(&this->pointerLocations,newSize);
    puVar3 = (this->pointerLocations).builder.pos;
  }
  *puVar3 = uVar2;
  (this->pointerLocations).builder.pos = puVar3 + 1;
  return uVar2;
}

Assistant:

uint addNewPointerLocation() {
      // Add a whole new pointer location to the union with the given size.

      return pointerLocations.add(parent.addPointer());
    }